

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# entropy_encode.c
# Opt level: O0

uint16_t BrotliReverseBits(size_t num_bits,uint16_t bits)

{
  uint uVar1;
  ulong local_28;
  size_t i;
  size_t retval;
  uint16_t bits_local;
  size_t num_bits_local;
  
  i = BrotliReverseBits::kLut[(int)(bits & 0xf)];
  retval._6_2_ = bits;
  for (local_28 = 4; local_28 < num_bits; local_28 = local_28 + 4) {
    uVar1 = (uint)retval._6_2_;
    retval._6_2_ = (uint16_t)((int)uVar1 >> 4);
    i = BrotliReverseBits::kLut[(int)((int)uVar1 >> 4 & 0xf)] | i << 4;
  }
  return (uint16_t)(i >> (-(char)num_bits & 3U));
}

Assistant:

static uint16_t BrotliReverseBits(size_t num_bits, uint16_t bits) {
  static const size_t kLut[16] = {  /* Pre-reversed 4-bit values. */
    0x00, 0x08, 0x04, 0x0C, 0x02, 0x0A, 0x06, 0x0E,
    0x01, 0x09, 0x05, 0x0D, 0x03, 0x0B, 0x07, 0x0F
  };
  size_t retval = kLut[bits & 0x0F];
  size_t i;
  for (i = 4; i < num_bits; i += 4) {
    retval <<= 4;
    bits = (uint16_t)(bits >> 4);
    retval |= kLut[bits & 0x0F];
  }
  retval >>= ((0 - num_bits) & 0x03);
  return (uint16_t)retval;
}